

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Invert(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 in_register_00001208 [56];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_ZMM7 [64];
  float w1;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  PLSample PVar52;
  float local_48 [6];
  float param_weight [4];
  
  auVar45._8_56_ = in_register_00001208;
  auVar45._0_8_ = sample.super_Tuple2<pbrt::Vector2,_float>;
  pvVar6 = (this->m_param_values).ptr;
  iVar16 = 0;
  lVar21 = 0;
  bVar12 = true;
  do {
    bVar20 = bVar12;
    uVar14 = this->m_param_size[lVar21];
    if ((ulong)uVar14 == 1) {
      uVar3 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_48 + lVar21 * 2) = uVar3;
    }
    else {
      pfVar7 = pvVar6[lVar21].ptr;
      if (uVar14 < 3) {
        uVar23 = 0;
      }
      else {
        uVar23 = (ulong)uVar14 - 2;
        lVar18 = 1;
        uVar24 = uVar23;
        do {
          uVar28 = uVar24 >> 1;
          uVar24 = ~uVar28 + uVar24;
          lVar13 = uVar28 + 1 + lVar18;
          if (param[lVar21] < pfVar7[uVar28 + lVar18 & 0xffffffff]) {
            uVar24 = uVar28;
            lVar13 = lVar18;
          }
          lVar18 = lVar13;
        } while (0 < (long)uVar24);
        if (lVar18 - 1U < uVar23) {
          uVar23 = lVar18 - 1U;
        }
        if (lVar18 < 1) {
          uVar23 = 0;
        }
      }
      auVar29._0_4_ =
           (param[lVar21] - pfVar7[uVar23 & 0xffffffff]) /
           (pfVar7[(int)uVar23 + 1] - pfVar7[uVar23 & 0xffffffff]);
      auVar29._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar30 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar29);
      uVar3 = vcmpss_avx512f(auVar29,ZEXT816(0) << 0x40,1);
      fVar1 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar30._0_4_);
      local_48[lVar21 * 2 + 1] = fVar1;
      local_48[lVar21 * 2] = 1.0 - fVar1;
      iVar16 = (int)uVar23 * this->m_param_strides[lVar21] + iVar16;
    }
    lVar21 = 1;
    bVar12 = false;
  } while (bVar20);
  fVar1 = (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x;
  fVar2 = (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar5 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  pfVar7 = (this->m_data).ptr;
  auVar41._4_4_ = local_48[1];
  auVar41._0_4_ = local_48[1];
  auVar41._8_4_ = local_48[1];
  auVar41._12_4_ = local_48[1];
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)local_48[0]));
  fVar10 = sample.super_Tuple2<pbrt::Vector2,_float>.x * fVar1;
  auVar30 = vmovshdup_avx(auVar45._0_16_);
  fVar11 = auVar30._0_4_ * fVar2;
  iVar25 = (int)fVar10;
  iVar15 = (int)fVar11;
  if (iVar4 + -2 < iVar25) {
    iVar25 = iVar4 + -2;
  }
  if (iVar5 + -2 < iVar15) {
    iVar15 = iVar5 + -2;
  }
  iVar22 = iVar5 * iVar4;
  auVar30 = vcvtsi2ss_avx512f(in_ZMM7._0_16_,iVar15);
  fVar10 = fVar10 - (float)iVar25;
  auVar30 = vsubss_avx512f(ZEXT416((uint)fVar11),auVar30);
  iVar17 = iVar22 * iVar16 + iVar15 * iVar4;
  uVar14 = iVar16 * iVar5 + iVar15;
  uVar26 = iVar25 + iVar17;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(pfVar7 + uVar26);
  iVar25 = this->m_param_strides[1] * iVar22;
  iVar22 = iVar22 * this->m_param_strides[0];
  iVar16 = iVar5 * this->m_param_strides[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(pfVar7 + (long)iVar4 + (ulong)uVar26);
  uVar27 = uVar26 + iVar25;
  uVar23 = (ulong)(iVar22 + uVar26);
  uVar19 = this->m_param_strides[1] * iVar5 + uVar14;
  uVar24 = (ulong)(iVar22 + uVar27);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(pfVar7 + uVar27);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(pfVar7 + (long)iVar4 + (ulong)uVar27);
  pfVar8 = (this->m_conditional_cdf).ptr;
  auVar31 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[uVar24]));
  auVar32 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[(long)iVar4 + uVar23]));
  auVar33 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[(long)iVar4 + uVar24]));
  auVar35._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + uVar23);
  auVar35._4_4_ = local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + uVar23) >> 0x20);
  auVar35._8_4_ = local_48[1] * 0.0;
  auVar35._12_4_ = local_48[1] * 0.0;
  auVar39._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar23);
  auVar39._4_4_ =
       local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar23) >> 0x20);
  auVar39._8_4_ = local_48[1] * 0.0;
  auVar39._12_4_ = local_48[1] * 0.0;
  auVar34 = vfmadd231ss_avx512f(ZEXT416((uint)(local_48[1] * pfVar8[uVar23])),auVar29,
                                ZEXT416((uint)pfVar8[uVar26]));
  auVar31 = vfmadd231ss_avx512f(auVar31,auVar29,ZEXT416((uint)pfVar8[uVar27]));
  auVar32 = vfmadd231ss_avx512f(auVar32,auVar29,ZEXT416((uint)pfVar8[(long)iVar4 + (ulong)uVar26]));
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar29,ZEXT416((uint)pfVar8[(long)iVar4 + (ulong)uVar27]));
  uVar26 = iVar4 + -1 + iVar17;
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar29,auVar37);
  auVar38._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + uVar24);
  auVar38._4_4_ = local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + uVar24) >> 0x20);
  auVar38._8_4_ = local_48[1] * 0.0;
  auVar38._12_4_ = local_48[1] * 0.0;
  auVar48._4_4_ = local_48[3];
  auVar48._0_4_ = local_48[3];
  auVar48._8_4_ = local_48[3];
  auVar48._12_4_ = local_48[3];
  auVar36 = vfmadd231ps_avx512vl(auVar39,auVar29,auVar49);
  auVar50._4_4_ = local_48[2];
  auVar50._0_4_ = local_48[2];
  auVar50._8_4_ = local_48[2];
  auVar50._12_4_ = local_48[2];
  auVar37 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[iVar22 + uVar26]));
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar29,auVar40);
  fVar44 = auVar30._0_4_;
  fVar11 = 1.0 - fVar44;
  auVar37 = vfmadd231ss_avx512f(auVar37,auVar29,ZEXT416((uint)pfVar8[uVar26]));
  auVar30 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[uVar26 + iVar25 + iVar22]));
  uVar27 = iVar17 + -1 + iVar4 * 2;
  auVar42._0_4_ = local_48[3] * auVar38._0_4_;
  auVar42._4_4_ = local_48[3] * auVar38._4_4_;
  auVar42._8_4_ = local_48[3] * auVar38._8_4_;
  auVar42._12_4_ = local_48[3] * auVar38._12_4_;
  auVar38 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[iVar22 + uVar27]));
  pfVar9 = (this->m_marginal_cdf).ptr;
  auVar39 = vfmadd231ss_avx512f(auVar30,auVar29,ZEXT416((uint)pfVar8[uVar26 + iVar25]));
  auVar40 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar8[iVar22 + iVar25 + uVar27]));
  auVar30 = vfmadd231ps_fma(auVar42,auVar50,auVar35);
  auVar35 = vfmadd231ss_avx512f(auVar38,auVar29,ZEXT416((uint)pfVar8[uVar27]));
  auVar38 = vfmadd231ss_avx512f(auVar40,auVar29,ZEXT416((uint)pfVar8[iVar25 + uVar27]));
  auVar40 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar9[iVar16 + uVar14]));
  auVar41 = vmulss_avx512f(auVar41,ZEXT416((uint)pfVar9[iVar16 + uVar19]));
  auVar43._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar24);
  auVar43._4_4_ =
       local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar24) >> 0x20);
  auVar43._8_4_ = local_48[1] * 0.0;
  auVar43._12_4_ = local_48[1] * 0.0;
  auVar42 = vfmadd231ps_avx512vl(auVar43,auVar29,auVar51);
  auVar43 = vfmadd231ss_avx512f(auVar41,auVar29,ZEXT416((uint)pfVar9[uVar19]));
  auVar40 = vfmadd231ss_avx512f(auVar40,auVar29,ZEXT416((uint)pfVar9[uVar14]));
  auVar46._0_4_ = local_48[3] * auVar42._0_4_;
  auVar46._4_4_ = local_48[3] * auVar42._4_4_;
  auVar46._8_4_ = local_48[3] * auVar42._8_4_;
  auVar46._12_4_ = local_48[3] * auVar42._12_4_;
  auVar29 = vfmadd231ps_fma(auVar46,auVar50,auVar36);
  auVar36._0_4_ = fVar44 * auVar29._0_4_;
  auVar36._4_4_ = fVar44 * auVar29._4_4_;
  auVar36._8_4_ = fVar44 * auVar29._8_4_;
  auVar36._12_4_ = fVar44 * auVar29._12_4_;
  auVar47._4_4_ = fVar11;
  auVar47._0_4_ = fVar11;
  auVar47._8_4_ = fVar11;
  auVar47._12_4_ = fVar11;
  auVar29 = vfmadd213ps_fma(auVar47,auVar30,auVar36);
  auVar30 = vmovshdup_avx(auVar29);
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * auVar30._0_4_)),auVar29,
                            ZEXT416((uint)(1.0 - fVar10)));
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)(auVar30._0_4_ - auVar29._0_4_)),
                            ZEXT416((uint)(fVar10 * 0.5)),auVar29);
  auVar29 = vmulss_avx512f(auVar48,auVar33);
  auVar32 = vfmadd231ss_avx512f(auVar29,auVar50,auVar32);
  auVar29 = vmulss_avx512f(auVar48,auVar31);
  auVar29 = vfmadd231ss_fma(auVar29,auVar50,auVar34);
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * auVar32._0_4_)),ZEXT416((uint)fVar11),auVar29);
  auVar29 = vmulss_avx512f(auVar48,auVar39);
  auVar29 = vfmadd231ss_avx512f(auVar29,auVar50,auVar37);
  auVar32 = vmulss_avx512f(auVar48,auVar38);
  auVar33 = vfmadd231ss_avx512f(auVar32,auVar50,auVar35);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * auVar33._0_4_)),auVar29,ZEXT416((uint)fVar11));
  auVar29 = vfmadd213ss_fma(ZEXT416((uint)(auVar33._0_4_ - auVar29._0_4_)),
                            ZEXT416((uint)(fVar44 * 0.5)),auVar29);
  auVar33 = vmulss_avx512f(auVar48,auVar43);
  auVar33 = vfmadd231ss_avx512f(auVar33,auVar50,auVar40);
  auVar30 = vinsertps_avx(ZEXT416((uint)((fVar10 * auVar30._0_4_ + auVar31._0_4_) / auVar32._0_4_)),
                          ZEXT416((uint)(fVar44 * auVar29._0_4_ + auVar33._0_4_)),0x10);
  PVar52.p.super_Tuple2<pbrt::Vector2,_float> = auVar30._0_8_;
  PVar52.pdf = auVar41._0_4_ * fVar1 * fVar2;
  return PVar52;
}

Assistant:

PBRT_CPU_GPU
    PLSample Invert(Vector2f sample, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Fetch values at corners of bilinear patch */
        sample.x *= m_inv_patch_size.x;
        sample.y *= m_inv_patch_size.y;
        Vector2i pos = Min(Vector2i(sample), m_size - Vector2i(2, 2));
        sample -= Vector2f(pos);

        uint32_t offset = pos.x + pos.y * m_size.x;
        uint32_t slice_size = HProd(m_size);
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        /* Invert the X component */
        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight);

        Vector2f w1 = sample, w0 = Vector2f(1, 1) - w1;

        float c0 = std::fma(w0.y, v00, w1.y * v01), c1 = std::fma(w0.y, v10, w1.y * v11),
              pdf = std::fma(w0.x, c0, w1.x * c1);

        sample.x *= c0 + .5f * sample.x * (c1 - c0);

        float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset, slice_size,
                                     param_weight),
              v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x, offset,
                                     slice_size, param_weight);

        sample.x += (1.f - sample.y) * v0 + sample.y * v1;

        offset = pos.y * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        sample.x /= (1.f - sample.y) * r0 + sample.y * r1;

        /* Invert the Y component */
        sample.y *= r0 + .5f * sample.y * (r1 - r0);

        offset = pos.y;
        if (Dimension != 0)
            offset += slice_offset * m_size.y;

        sample.y +=
            lookup<Dimension>(m_marginal_cdf.data(), offset, m_size.y, param_weight);

        return {sample, pdf * HProd(m_inv_patch_size)};
    }